

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxFlopFunctionCall::Resolve(FxFlopFunctionCall *this,FCompileContext *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  FxConstant *this_00;
  FxFloatCast *this_01;
  FxExpression *pFVar2;
  double dVar3;
  ExpVal local_20;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if ((this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count == 1) {
      iVar1 = (*(*(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array)->
                _vptr_FxExpression[2])();
      *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array =
           (FxExpression *)CONCAT44(extraout_var,iVar1);
      pFVar2 = *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
      if (pFVar2 != (FxExpression *)0x0) {
        iVar1 = (*(pFVar2->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])();
        if ((char)iVar1 != '\0') {
          iVar1 = (*(*(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array)->
                    _vptr_FxExpression[3])();
          if ((char)iVar1 != '\0') {
            pFVar2 = *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array + 1;
            ExpVal::ExpVal(&local_20,(ExpVal *)pFVar2);
            dVar3 = ExpVal::GetFloat(&local_20);
            ExpVal::~ExpVal(&local_20);
            dVar3 = (*FxFlops[this->Index].Evaluate)(dVar3);
            this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar2);
            FxConstant::FxConstant(this_00,dVar3,&(this->super_FxExpression).ScriptPosition);
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            return &this_00->super_FxExpression;
          }
          if ((*(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array)->ValueType->
              RegType == '\0') {
            this_01 = (FxFloatCast *)FxExpression::operator_new((FxExpression *)0x30,(size_t)ctx);
            FxFloatCast::FxFloatCast
                      (this_01,*(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array);
            *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array =
                 (FxExpression *)this_01;
          }
          (this->super_FxExpression).ValueType = (PType *)TypeFloat64;
          return &this->super_FxExpression;
        }
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "numeric value expected for parameter");
      }
    }
    else {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"%s only has one parameter",
                 FName::NameData.NameArray[(int)FxFlops[this->Index].Name].Text);
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxFlopFunctionCall *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxFlopFunctionCall::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();

	if (ArgList.Size() != 1)
	{
		ScriptPosition.Message(MSG_ERROR, "%s only has one parameter", FName(FxFlops[Index].Name).GetChars());
		delete this;
		return nullptr;
	}

	ArgList[0] = ArgList[0]->Resolve(ctx);
	if (ArgList[0] == nullptr)
	{
		delete this;
		return nullptr;
	}

	if (!ArgList[0]->IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "numeric value expected for parameter");
		delete this;
		return nullptr;
	}
	if (ArgList[0]->isConstant())
	{
		double v = static_cast<FxConstant *>(ArgList[0])->GetValue().GetFloat();
		v = FxFlops[Index].Evaluate(v);
		FxExpression *x = new FxConstant(v, ScriptPosition);
		delete this;
		return x;
	}
	if (ArgList[0]->ValueType->GetRegType() == REGT_INT)
	{
		ArgList[0] = new FxFloatCast(ArgList[0]);
	}
	ValueType = TypeFloat64;
	return this;
}